

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShaderPT_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int stagept)

{
  char *pcVar1;
  ostringstream os;
  ostream oStack_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_188);
  if ((int)this == 1) {
    pcVar1 = 
    "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);"
    ;
  }
  else {
    if ((int)this != 0) goto LAB_00c84a4b;
    pcVar1 = 
    "\nvoid main() {\n  gl_Position = vec4(0,0,0,1);\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif";
  }
  std::operator<<(&oStack_188,pcVar1);
LAB_00c84a4b:
  std::operator<<(&oStack_188,"\n}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_188);
  return __return_storage_ptr__;
}

Assistant:

std::string BuildShaderPT(int stagept)
	{
		std::ostringstream os;
		if (stagept == vertex)
		{
			os << NL "void main() {" NL "  gl_Position = vec4(0,0,0,1);" NL "#ifdef GL_ES" NL
					 "  gl_PointSize = 1.0f;" NL "#endif";
		}
		if (stagept == fragment)
		{
			os << NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
					 "  o_color = vec4(0.0, 1.0, 0.0, 1.0);";
		}
		os << NL "}";
		return os.str();
	}